

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O3

exr_result_t
internal_exr_calc_header_version_flags(exr_const_context_t_conflict ctxt,uint32_t *flags)

{
  exr_attribute_t *peVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  
  uVar2 = (uint)(ctxt->is_multipart != '\0') << 0xc;
  uVar3 = uVar2 | 2;
  *flags = uVar3;
  if ((0x1f < ctxt->max_name_length) && (0 < (long)ctxt->num_parts)) {
    lVar5 = 0;
    do {
      lVar6 = (long)(ctxt->parts[lVar5]->attributes).num_attributes;
      if (0 < lVar6) {
        bVar7 = true;
        lVar4 = 0;
LAB_0012879e:
        do {
          peVar1 = (ctxt->parts[lVar5]->attributes).entries[lVar4];
          if ((0x1f < peVar1->name_length) || (0x1f < peVar1->type_name_length)) goto LAB_00128805;
          if (peVar1->type == EXR_ATTR_CHLIST) {
            lVar9 = (long)((peVar1->field_6).chlist)->num_channels;
            if (0 < lVar9) {
              lVar8 = 0;
              do {
                if (0x1f < *(int *)(((peVar1->field_6).chlist)->entries->reserved + lVar8 + -0x15))
                {
                  lVar4 = lVar4 + 1;
                  bVar7 = false;
                  if (lVar4 == lVar6) goto LAB_00128805;
                  goto LAB_0012879e;
                }
                lVar8 = lVar8 + 0x20;
              } while (lVar9 * 0x20 != lVar8);
            }
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != lVar6);
        if (!bVar7) {
LAB_00128805:
          uVar3 = uVar2 | 0x402;
          *flags = uVar3;
          break;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != ctxt->num_parts);
  }
  if (ctxt->has_nonimage_data != '\0') {
    uVar3 = uVar3 | 0x800;
    *flags = uVar3;
  }
  if (ctxt->is_singlepart_tiled != '\0') {
    *flags = uVar3 | 0x200;
  }
  return 0;
}

Assistant:

exr_result_t internal_exr_calc_header_version_flags (exr_const_context_t ctxt, uint32_t *flags)
{
    *flags = 2; // EXR_VERSION

    if (ctxt->is_multipart) *flags |= EXR_MULTI_PART_FLAG;

    if (ctxt->max_name_length > EXR_SHORTNAME_MAXLEN)
    {
        int longnamefound = 0;

        for ( int p = 0; p < ctxt->num_parts; ++p )
        {
            exr_priv_part_t curpart = ctxt->parts[p];
            for ( int a = 0; a < curpart->attributes.num_attributes; ++a )
            {
                exr_attribute_t *cura = curpart->attributes.entries[a];
                if (cura->name_length > EXR_SHORTNAME_MAXLEN ||
                    cura->type_name_length > EXR_SHORTNAME_MAXLEN)
                {
                    longnamefound = 1;
                    break;
                }

                // the original C++ side assumes there was
                // only one channel list (who would have multiple)
                // but let's not make that same assertion and check names
                // if we encounter any channel list named anything
                if (cura->type == EXR_ATTR_CHLIST)
                {
                    const exr_attr_chlist_t* chlist = cura->chlist;
                    int nc = chlist->num_channels;

                    for ( int c = 0; c < nc; ++c )
                    {
                        const exr_attr_chlist_entry_t *ce = chlist->entries + c;
                        if (ce->name.length > EXR_SHORTNAME_MAXLEN)
                        {
                            longnamefound = 1;
                            break;
                        }
                    }
                }
            }

            if (longnamefound)
                break;
        }

        if (longnamefound)
            *flags |= EXR_LONG_NAMES_FLAG;
    }

    if (ctxt->has_nonimage_data) *flags |= EXR_NON_IMAGE_FLAG;
    if (ctxt->is_singlepart_tiled) *flags |= EXR_TILED_FLAG;

    return EXR_ERR_SUCCESS;
}